

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O3

bool oldDecrunch(RGBE *scanline,int len,FILE *file)

{
  RGBE auVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (len < 1) {
    return true;
  }
  uVar5 = 0;
  do {
    iVar2 = fgetc((FILE *)file);
    (*scanline)[0] = (uchar)iVar2;
    iVar2 = fgetc((FILE *)file);
    (*scanline)[1] = (uchar)iVar2;
    iVar2 = fgetc((FILE *)file);
    (*scanline)[2] = (uchar)iVar2;
    iVar2 = fgetc((FILE *)file);
    (*scanline)[3] = (uchar)iVar2;
    iVar2 = feof((FILE *)file);
    if (iVar2 != 0) {
      return false;
    }
    if ((((*scanline)[0] == '\x01') && ((*scanline)[1] == '\x01')) && ((*scanline)[2] == '\x01')) {
      iVar3 = (uint)(*scanline)[3] << (uVar5 & 0x1f);
      if (0 < (int)((uint)(*scanline)[3] << (uVar5 & 0x1f))) {
        auVar1 = scanline[-1];
        uVar4 = iVar3 + 1;
        do {
          *scanline = auVar1;
          scanline = scanline + 1;
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
        len = len - iVar3;
      }
      uVar5 = uVar5 + 8;
    }
    else {
      scanline = scanline + 1;
      len = len + -1;
      uVar5 = 0;
    }
  } while (0 < len);
  return iVar2 == 0;
}

Assistant:

bool oldDecrunch(RGBE *scanline, int len, FILE *file)
{
	int i;
	int rshift = 0;
	
	while (len > 0) {
		scanline[0][R] = fgetc(file);
		scanline[0][G] = fgetc(file);
		scanline[0][B] = fgetc(file);
		scanline[0][E] = fgetc(file);
		if (feof(file))
			return false;

		if (scanline[0][R] == 1 &&
			scanline[0][G] == 1 &&
			scanline[0][B] == 1) {
			for (i = scanline[0][E] << rshift; i > 0; i--) {
				memcpy(&scanline[0][0], &scanline[-1][0], 4);
				scanline++;
				len--;
			}
			rshift += 8;
		}
		else {
			scanline++;
			len--;
			rshift = 0;
		}
	}
	return true;
}